

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O3

void Abc_NodeStrashUsingNetwork_rec(Abc_Ntk_t *pNtkAig,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 6) {
    if ((pObj->field_6).pTemp == (void *)0x0) {
      if (0 < (pObj->vFanins).nSize) {
        iVar2 = 0;
        do {
          pAVar1 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
          if (pAVar1->pNtk->ntkType == ABC_NTK_NETLIST) {
            pAVar1 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
          }
          Abc_NodeStrashUsingNetwork_rec(pNtkAig,pAVar1);
          iVar2 = iVar2 + 1;
        } while (iVar2 < (pObj->vFanins).nSize);
      }
      pAVar1 = Abc_NodeStrash(pNtkAig,pObj,0);
      (pObj->field_6).pCopy = pAVar1;
      *(Abc_Obj_t **)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray] + 0x40) = pAVar1;
    }
    return;
  }
  __assert_fail("!Abc_ObjIsNet(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLib.c"
                ,0x157,"void Abc_NodeStrashUsingNetwork_rec(Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_NodeStrashUsingNetwork_rec( Abc_Ntk_t * pNtkAig, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( !Abc_ObjIsNet(pObj) );
    if ( pObj->pCopy )
        return;
    // call for the fanins
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NodeStrashUsingNetwork_rec( pNtkAig, Abc_ObjFanin0Ntk(Abc_ObjFanin0(pObj)) );
    // compute for the node
    pObj->pCopy = Abc_NodeStrash( pNtkAig, pObj, 0 );
    // set for the fanout net
    Abc_ObjFanout0(pObj)->pCopy = pObj->pCopy;
}